

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SameValueComparer.h
# Opt level: O2

hash_t Js::SameValueComparerCommon<void_*,_true>::GetHashCode(Var i)

{
  Type TVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  int32 iVar5;
  hash_t hVar6;
  BOOL BVar7;
  charcount_t length;
  undefined4 *puVar8;
  RecyclableObject *this;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptString *this_00;
  char16 *s;
  double d;
  
  if (i == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00b87f60;
    *puVar8 = 0;
  }
  bVar4 = TaggedInt::Is(i);
  if (bVar4) {
switchD_00b87ef1_caseD_3:
    iVar5 = TaggedInt::ToInt32(i);
    d = (double)iVar5;
  }
  else {
    if ((ulong)i >> 0x32 == 0) {
      this = UnsafeVarTo<Js::RecyclableObject>(i);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00b87f60;
        *puVar8 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((0x57 < (int)TVar1) && (BVar7 = RecyclableObject::IsExternal(this), BVar7 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_00b87f60:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      switch(TVar1) {
      case TypeIds_FirstNumberType:
        goto switchD_00b87ef1_caseD_3;
      case TypeIds_Number:
        break;
      case TypeIds_Int64Number:
      case TypeIds_LastNumberType:
        pJVar9 = VarTo<Js::JavascriptTypedNumber<long>>(i);
        lVar2 = pJVar9->m_value;
        d = (double)lVar2;
        if (lVar2 != (long)d) {
          return (uint)((ulong)lVar2 >> 0x20) ^ (uint)lVar2;
        }
        goto LAB_00b87e01;
      case TypeIds_String:
        this_00 = UnsafeVarTo<Js::JavascriptString>(i);
        s = JavascriptString::GetString(this_00);
        length = JavascriptString::GetLength(this_00);
        hVar6 = JsUtil::CharacterBuffer<char16_t>::InternalGetHashCode<false>(s,length);
        return hVar6;
      default:
        return (hash_t)((ulong)i >> 4);
      }
    }
    d = JavascriptNumber::GetValue(i);
  }
LAB_00b87e01:
  hVar6 = HashDouble(d);
  return hVar6;
}

Assistant:

static hash_t GetHashCode(Var i)
        {
            switch (JavascriptOperators::GetTypeId(i))
            {
            case TypeIds_Integer:
                // int32 can be fully represented in a double, so hash it as a double
                // to ensure that tagged ints hash to the same value as JavascriptNumbers.
                return HashDouble((double)TaggedInt::ToInt32(i));

            case TypeIds_Int64Number:
            case TypeIds_UInt64Number:
                {
                    __int64 v = VarTo<JavascriptInt64Number>(i)->GetValue();
                    double d = (double) v;
                    if (v != (__int64) d)
                    {
                        // this int64 is too large to represent in a double
                        // and thus will never be equal to a double so hash it
                        // as an int64
                        return (uint)v ^ (uint)(v >> 32);
                    }

                    // otherwise hash it as a double
                    return HashDouble(d);
                }

            case TypeIds_Number:
                {
                    double d = JavascriptNumber::GetValue(i);
                    return HashDouble(d);
                }

            case TypeIds_String:
                {
                    JavascriptString* v = UnsafeVarTo<JavascriptString>(i);
                    return JsUtil::CharacterBuffer<WCHAR>::StaticGetHashCode(v->GetString(), v->GetLength());
                }

            default:
                return RecyclerPointerComparer<Var>::GetHashCode(i);
            }
        }